

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpendableReload.cpp
# Opt level: O1

void __thiscall DIS::ExpendableReload::ExpendableReload(ExpendableReload *this)

{
  this->_vptr_ExpendableReload = (_func_int **)&PTR__ExpendableReload_001b4af0;
  EntityType::EntityType(&this->_expendable);
  this->_station = 0;
  this->_standardQuantity = 0;
  this->_maximumQuantity = 0;
  this->_standardQuantityReloadTime = 0;
  this->_maximumQuantityReloadTime = 0;
  return;
}

Assistant:

ExpendableReload::ExpendableReload():
   _expendable(), 
   _station(0), 
   _standardQuantity(0), 
   _maximumQuantity(0), 
   _standardQuantityReloadTime(0), 
   _maximumQuantityReloadTime(0)
{
}